

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int check_repeat_ref_mv(MB_MODE_INFO_EXT *mbmi_ext,int ref_idx,MV_REFERENCE_FRAME *ref_frame,
                       PREDICTION_MODE single_mode)

{
  byte bVar1;
  char in_CL;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int_mv this_mv;
  int ref_mv_idx;
  int stack_size;
  int ref_mv_count;
  uint8_t ref_frame_type;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  int local_30;
  
  bVar1 = av1_ref_frame_type((MV_REFERENCE_FRAME *)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  uVar2 = (uint)*(byte *)(in_RDI + 0x488 + (ulong)bVar1);
  if (in_CL == '\r') {
    return 0;
  }
  if (in_CL == '\x0e') {
    if (uVar2 < 2) {
      return 1;
    }
  }
  else if (in_CL == '\x0f') {
    if (uVar2 == 0) {
      return 1;
    }
    if (uVar2 == 1) {
      return 0;
    }
    if (4 < uVar2) {
      uVar2 = 4;
    }
    for (local_30 = 0; local_30 < (int)uVar2; local_30 = local_30 + 1) {
      if (in_ESI == 0) {
        iVar3 = *(int *)(in_RDI + (ulong)bVar1 * 0x20 + (long)local_30 * 8);
      }
      else {
        iVar3 = *(int *)(in_RDI + (ulong)bVar1 * 0x20 + 4 + (long)local_30 * 8);
      }
      if (iVar3 == *(int *)(in_RDI + 0x4a8 + (long)*(char *)(in_RDX + in_ESI) * 4)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static inline int check_repeat_ref_mv(const MB_MODE_INFO_EXT *mbmi_ext,
                                      int ref_idx,
                                      const MV_REFERENCE_FRAME *ref_frame,
                                      PREDICTION_MODE single_mode) {
  const uint8_t ref_frame_type = av1_ref_frame_type(ref_frame);
  const int ref_mv_count = mbmi_ext->ref_mv_count[ref_frame_type];
  assert(single_mode != NEWMV);
  if (single_mode == NEARESTMV) {
    return 0;
  } else if (single_mode == NEARMV) {
    // when ref_mv_count = 0, NEARESTMV and NEARMV are same as GLOBALMV
    // when ref_mv_count = 1, NEARMV is same as GLOBALMV
    if (ref_mv_count < 2) return 1;
  } else if (single_mode == GLOBALMV) {
    // when ref_mv_count == 0, GLOBALMV is same as NEARESTMV
    if (ref_mv_count == 0) return 1;
    // when ref_mv_count == 1, NEARMV is same as GLOBALMV
    else if (ref_mv_count == 1)
      return 0;

    int stack_size = AOMMIN(USABLE_REF_MV_STACK_SIZE, ref_mv_count);
    // Check GLOBALMV is matching with any mv in ref_mv_stack
    for (int ref_mv_idx = 0; ref_mv_idx < stack_size; ref_mv_idx++) {
      int_mv this_mv;

      if (ref_idx == 0)
        this_mv = mbmi_ext->ref_mv_stack[ref_frame_type][ref_mv_idx].this_mv;
      else
        this_mv = mbmi_ext->ref_mv_stack[ref_frame_type][ref_mv_idx].comp_mv;

      if (this_mv.as_int == mbmi_ext->global_mvs[ref_frame[ref_idx]].as_int)
        return 1;
    }
  }
  return 0;
}